

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_read_line_buffered(FILE *fp)

{
  char **unaff_retaddr;
  int local_4;
  
  ngp_free_line();
  if (ngp_prevline.line == (char *)0x0) {
    ngp_curline.flags = 0;
    local_4 = ngp_line_from_file(fp,unaff_retaddr);
  }
  else {
    memcpy(&ngp_curline,&ngp_prevline,0x30);
    ngp_prevline.line = (char *)0x0;
    ngp_prevline.name = (char *)0x0;
    ngp_prevline.value = (char *)0x0;
    ngp_prevline.comment = (char *)0x0;
    ngp_prevline.type = 0;
    ngp_prevline.format = 0;
    ngp_prevline.flags = 0;
    ngp_curline.flags = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int	ngp_read_line_buffered(FILE *fp)
 {
   ngp_free_line();				/* first free current line (if any) */
   
   if (NULL != ngp_prevline.line)		/* if cached, return cached line */
     { ngp_curline = ngp_prevline;
       ngp_prevline.line = NULL;
       ngp_prevline.name = NULL;
       ngp_prevline.value = NULL;
       ngp_prevline.comment = NULL;
       ngp_prevline.type = NGP_TTYPE_UNKNOWN;
       ngp_prevline.format = NGP_FORMAT_OK;
       ngp_prevline.flags = 0;
       ngp_curline.flags = NGP_LINE_REREAD;
       return(NGP_OK);
     }

   ngp_curline.flags = 0;   			/* if not cached really read line from file */
   return(ngp_line_from_file(fp, &(ngp_curline.line)));
 }